

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O2

void des_cbc_decrypt(ssh_cipher *ciph,void *vdata,int len)

{
  LR lr;
  LR LVar1;
  
  for (; 0 < len; len = len + -8) {
    lr = des_load_lr(vdata);
    LVar1 = des_full_cipher(lr,(des_keysched *)(ciph + -0x11),0xf,0xffffffffffffffff);
    des_store_lr(vdata,(LR)((ulong)LVar1 ^ (ulong)ciph[-1].vt));
    *(LR *)(ciph + -1) = lr;
    vdata = (void *)((long)vdata + 8);
  }
  return;
}

Assistant:

static void des_cbc_decrypt(ssh_cipher *ciph, void *vdata, int len)
{
    struct des_cbc_ctx *ctx = container_of(ciph, struct des_cbc_ctx, ciph);
    uint8_t *data = (uint8_t *)vdata;
    for (; len > 0; len -= 8, data += 8) {
        LR ciphertext = des_load_lr(data);
        LR cipher_out = des_full_cipher(ciphertext, &ctx->sched, DECIPHER);
        LR plaintext = des_xor_lr(cipher_out, ctx->iv);
        des_store_lr(data, plaintext);
        ctx->iv = ciphertext;
    }
}